

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

VkResult __thiscall
myvk::CommandBuffer::Submit
          (CommandBuffer *this,SemaphoreStageGroup *wait_semaphores,
          SemaphoreGroup *signal_semaphores,Ptr<Fence> *fence)

{
  pointer ppVVar1;
  element_type *peVar2;
  VkResult VVar3;
  ulong uVar4;
  VkFence pVVar5;
  pthread_mutex_t *__mutex;
  VkSubmitInfo info;
  
  info.pNext = (void *)0x0;
  info.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  info.signalSemaphoreCount = 0;
  info._60_4_ = 0;
  info.waitSemaphoreCount = 0;
  info._20_4_ = 0;
  info.pWaitSemaphores = (VkSemaphore *)0x0;
  info.pSignalSemaphores = (VkSemaphore *)0x0;
  info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  info._4_4_ = 0;
  info.commandBufferCount = 1;
  info._44_4_ = 0;
  info.pCommandBuffers = &this->m_command_buffer;
  ppVVar1 = (wait_semaphores->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(wait_semaphores->m_semaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
  if ((int)uVar4 != 0) {
    info._16_8_ = uVar4 & 0xffffffff;
    info.pWaitDstStageMask =
         (wait_semaphores->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
         ._M_impl.super__Vector_impl_data._M_start;
    info.pWaitSemaphores = ppVVar1;
  }
  ppVVar1 = (signal_semaphores->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(signal_semaphores->m_semaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
  if ((int)uVar4 != 0) {
    info._56_8_ = uVar4 & 0xffffffff;
    info.pSignalSemaphores = ppVVar1;
  }
  __mutex = (pthread_mutex_t *)
            &((((((this->m_command_pool_ptr).
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  peVar2 = (fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    pVVar5 = (VkFence)0x0;
  }
  else {
    pVVar5 = peVar2->m_fence;
  }
  VVar3 = (*vkQueueSubmit)(((((((this->m_command_pool_ptr).
                                super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->m_queue_ptr).
                              super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            m_unique_queue_ptr).
                            super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->m_queue,1,&info,pVVar5);
  pthread_mutex_unlock(__mutex);
  return VVar3;
}

Assistant:

VkResult CommandBuffer::Submit(const SemaphoreStageGroup &wait_semaphores, const SemaphoreGroup &signal_semaphores,
                               const Ptr<Fence> &fence) const {
	VkSubmitInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;

	info.commandBufferCount = 1;
	info.pCommandBuffers = &m_command_buffer;

	if (wait_semaphores.GetCount()) {
		info.waitSemaphoreCount = wait_semaphores.GetCount();
		info.pWaitSemaphores = wait_semaphores.GetSemaphoresPtr();
		info.pWaitDstStageMask = wait_semaphores.GetWaitStagesPtr();
	}

	if (signal_semaphores.GetCount()) {
		info.signalSemaphoreCount = signal_semaphores.GetCount();
		info.pSignalSemaphores = signal_semaphores.GetSemaphoresPtr();
	}

	std::lock_guard<std::mutex> lock_guard{m_command_pool_ptr->GetQueuePtr()->GetMutex()};
	return vkQueueSubmit(m_command_pool_ptr->GetQueuePtr()->GetHandle(), 1, &info,
	                     fence ? fence->GetHandle() : VK_NULL_HANDLE);
}